

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O0

void __thiscall
xe::TcpIpRecvThread::handleMessage
          (TcpIpRecvThread *this,MessageType messageType,deUint8 *data,size_t dataSize)

{
  TcpIpLinkState *this_00;
  deBool dVar1;
  CommLinkState CVar2;
  char *error;
  Error *pEVar3;
  bool bVar4;
  undefined1 local_78 [8];
  ProcessFinishedMessage msg_1;
  ProcessLaunchFailedMessage msg;
  size_t local_28;
  size_t dataSize_local;
  deUint8 *data_local;
  MessageType messageType_local;
  TcpIpRecvThread *this_local;
  
  if (messageType == MESSAGETYPE_KEEPALIVE) {
    TcpIpLinkState::onKeepaliveReceived(this->m_state);
  }
  else if (messageType == MESSAGETYPE_PROCESS_STARTED) {
    do {
      dVar1 = deGetFalse();
      bVar4 = false;
      if (dVar1 == 0) {
        CVar2 = TcpIpLinkState::getState(this->m_state);
        bVar4 = CVar2 == COMMLINKSTATE_TEST_PROCESS_LAUNCHING;
      }
      if (!bVar4) {
        pEVar3 = (Error *)__cxa_allocate_exception(0x10);
        Error::Error(pEVar3,"Unexpected PROCESS_STARTED message",
                     "m_state.getState() == COMMLINKSTATE_TEST_PROCESS_LAUNCHING",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                     ,0x173);
        __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
      }
      dVar1 = deGetFalse();
    } while (dVar1 != 0);
    TcpIpLinkState::setState(this->m_state,COMMLINKSTATE_TEST_PROCESS_RUNNING,"");
  }
  else if (messageType == MESSAGETYPE_PROCESS_LAUNCH_FAILED) {
    xs::ProcessLaunchFailedMessage::ProcessLaunchFailedMessage
              ((ProcessLaunchFailedMessage *)&msg_1.super_Message.type,data,dataSize);
    do {
      dVar1 = deGetFalse();
      bVar4 = false;
      if (dVar1 == 0) {
        CVar2 = TcpIpLinkState::getState(this->m_state);
        bVar4 = CVar2 == COMMLINKSTATE_TEST_PROCESS_LAUNCHING;
      }
      if (!bVar4) {
        pEVar3 = (Error *)__cxa_allocate_exception(0x10);
        Error::Error(pEVar3,"Unexpected PROCESS_LAUNCH_FAILED message",
                     "m_state.getState() == COMMLINKSTATE_TEST_PROCESS_LAUNCHING",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                     ,0x17a);
        __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
      }
      dVar1 = deGetFalse();
    } while (dVar1 != 0);
    this_00 = this->m_state;
    error = (char *)std::__cxx11::string::c_str();
    TcpIpLinkState::setState(this_00,COMMLINKSTATE_TEST_PROCESS_LAUNCH_FAILED,error);
    xs::ProcessLaunchFailedMessage::~ProcessLaunchFailedMessage
              ((ProcessLaunchFailedMessage *)&msg_1.super_Message.type);
  }
  else if (messageType == MESSAGETYPE_PROCESS_FINISHED) {
    do {
      dVar1 = deGetFalse();
      bVar4 = false;
      if (dVar1 == 0) {
        CVar2 = TcpIpLinkState::getState(this->m_state);
        bVar4 = CVar2 == COMMLINKSTATE_TEST_PROCESS_RUNNING;
      }
      if (!bVar4) {
        pEVar3 = (Error *)__cxa_allocate_exception(0x10);
        Error::Error(pEVar3,"Unexpected PROCESS_FINISHED message",
                     "m_state.getState() == COMMLINKSTATE_TEST_PROCESS_RUNNING",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                     ,0x181);
        __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
      }
      dVar1 = deGetFalse();
    } while (dVar1 != 0);
    xs::ProcessFinishedMessage::ProcessFinishedMessage
              ((ProcessFinishedMessage *)local_78,data,dataSize);
    TcpIpLinkState::setState(this->m_state,COMMLINKSTATE_TEST_PROCESS_FINISHED,"");
    xs::ProcessFinishedMessage::~ProcessFinishedMessage((ProcessFinishedMessage *)local_78);
  }
  else {
    if (1 < messageType - MESSAGETYPE_PROCESS_LOG_DATA) {
      pEVar3 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(pEVar3,"Unknown message","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                   ,0x198);
      __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
    }
    local_28 = dataSize;
    if (data[dataSize - 1] == '\0') {
      local_28 = dataSize - 1;
    }
    if (messageType == MESSAGETYPE_PROCESS_LOG_DATA) {
      do {
        dVar1 = deGetFalse();
        bVar4 = false;
        if (dVar1 == 0) {
          CVar2 = TcpIpLinkState::getState(this->m_state);
          bVar4 = CVar2 == COMMLINKSTATE_TEST_PROCESS_RUNNING;
        }
        if (!bVar4) {
          pEVar3 = (Error *)__cxa_allocate_exception(0x10);
          Error::Error(pEVar3,"Unexpected PROCESS_LOG_DATA message",
                       "m_state.getState() == COMMLINKSTATE_TEST_PROCESS_RUNNING",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                       ,400);
          __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
        }
        dVar1 = deGetFalse();
      } while (dVar1 != 0);
      TcpIpLinkState::onTestLogData(this->m_state,data,local_28);
    }
    else {
      TcpIpLinkState::onInfoLogData(this->m_state,data,local_28);
    }
  }
  return;
}

Assistant:

void TcpIpRecvThread::handleMessage (xs::MessageType messageType, const deUint8* data, size_t dataSize)
{
	switch (messageType)
	{
		case xs::MESSAGETYPE_KEEPALIVE:
			m_state.onKeepaliveReceived();
			break;

		case xs::MESSAGETYPE_PROCESS_STARTED:
			XE_CHECK_MSG(m_state.getState() == COMMLINKSTATE_TEST_PROCESS_LAUNCHING, "Unexpected PROCESS_STARTED message");
			m_state.setState(COMMLINKSTATE_TEST_PROCESS_RUNNING);
			break;

		case xs::MESSAGETYPE_PROCESS_LAUNCH_FAILED:
		{
			xs::ProcessLaunchFailedMessage msg(data, dataSize);
			XE_CHECK_MSG(m_state.getState() == COMMLINKSTATE_TEST_PROCESS_LAUNCHING, "Unexpected PROCESS_LAUNCH_FAILED message");
			m_state.setState(COMMLINKSTATE_TEST_PROCESS_LAUNCH_FAILED, msg.reason.c_str());
			break;
		}

		case xs::MESSAGETYPE_PROCESS_FINISHED:
		{
			XE_CHECK_MSG(m_state.getState() == COMMLINKSTATE_TEST_PROCESS_RUNNING, "Unexpected PROCESS_FINISHED message");
			xs::ProcessFinishedMessage msg(data, dataSize);
			m_state.setState(COMMLINKSTATE_TEST_PROCESS_FINISHED);
			DE_UNREF(msg); // \todo [2012-06-19 pyry] Report exit code.
			break;
		}

		case xs::MESSAGETYPE_PROCESS_LOG_DATA:
		case xs::MESSAGETYPE_INFO:
			// Ignore leading \0 if such is present. \todo [2012-06-19 pyry] Improve protocol.
			if (data[dataSize-1] == 0)
				dataSize -= 1;

			if (messageType == xs::MESSAGETYPE_PROCESS_LOG_DATA)
			{
				XE_CHECK_MSG(m_state.getState() == COMMLINKSTATE_TEST_PROCESS_RUNNING, "Unexpected PROCESS_LOG_DATA message");
				m_state.onTestLogData(&data[0], dataSize);
			}
			else
				m_state.onInfoLogData(&data[0], dataSize);
			break;

		default:
			XE_FAIL("Unknown message");
	}
}